

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int doInstall(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char **data;
  char *pcVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  size_t sStack_90;
  QByteArrayView local_88;
  QArrayDataPointer<char16_t> local_78;
  QByteArrayView local_58;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc == 0) {
    pcVar3 = "Error: -install requires further arguments\n";
    sStack_90 = 0x2b;
LAB_0020acfb:
    fwrite(pcVar3,sStack_90,1,_stderr);
  }
  else {
    pcVar3 = *argv;
    iVar2 = strcmp(pcVar3,"qinstall");
    if (iVar2 == 0) {
      data = argv + 1;
      if (argc == 3) {
        bVar1 = false;
LAB_0020abed:
        local_48.size = -0x5555555555555556;
        local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_48.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        QByteArrayView::QByteArrayView<char_*,_true>(&local_58,data);
        QVar4.m_data = (storage_type *)local_58.m_size;
        QVar4.m_size = (qsizetype)&local_48;
        QString::fromLocal8Bit(QVar4);
        local_78.size = -0x5555555555555556;
        local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_78.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        QByteArrayView::QByteArrayView<char_*,_true>(&local_88,data + 1);
        QVar5.m_data = (storage_type *)local_88.m_size;
        QVar5.m_size = (qsizetype)&local_78;
        QString::fromLocal8Bit(QVar5);
        if (bVar1) {
          iVar2 = installFile((QString *)&local_48,(QString *)&local_78,true,false);
        }
        else {
          iVar2 = installFileOrDirectory((QString *)&local_48,(QString *)&local_78,false);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        goto LAB_0020ac97;
      }
      if (argc == 4) {
        iVar2 = strcmp(*data,"-exe");
        if (iVar2 == 0) {
          data = argv + 2;
          bVar1 = true;
          goto LAB_0020abed;
        }
      }
      pcVar3 = "Error: usage: [-exe] source target\n";
      sStack_90 = 0x23;
      goto LAB_0020acfb;
    }
    fprintf(_stderr,"Error: unrecognized -install subcommand \'%s\'\n",pcVar3);
  }
  iVar2 = 3;
LAB_0020ac97:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int doInstall(int argc, char **argv)
{
    if (!argc) {
        fprintf(stderr, "Error: -install requires further arguments\n");
        return 3;
    }
#ifdef Q_OS_WIN
    if (!strcmp(argv[0], "sed"))
        return doSed(argc - 1, argv + 1);
    if (!strcmp(argv[0], "ln"))
        return doLink(argc - 1, argv + 1);
#endif
    if (!strcmp(argv[0], "qinstall"))
        return doQInstall(argc - 1, argv + 1);
    fprintf(stderr, "Error: unrecognized -install subcommand '%s'\n", argv[0]);
    return 3;
}